

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O2

int get_one_and_zeros_padding(uchar *input,size_t input_len,size_t *data_len)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar8;
  byte bVar7;
  
  iVar1 = -0x6100;
  if (data_len != (size_t *)0x0 && input != (uchar *)0x0) {
    *data_len = 0;
    bVar6 = 0x80;
    uVar2 = 0;
    bVar5 = 0;
    for (uVar3 = input_len - 1; uVar3 != 0xffffffffffffffff; uVar3 = uVar3 - 1) {
      bVar4 = input[uVar3] != '\0' | bVar5;
      bVar7 = 0;
      uVar8 = uVar3;
      if (bVar4 == bVar5) {
        uVar8 = 0;
      }
      uVar2 = uVar2 | uVar8;
      *data_len = uVar2;
      if (bVar4 != bVar5) {
        bVar7 = input[uVar3];
      }
      bVar6 = bVar7 ^ bVar6;
      bVar5 = bVar4;
    }
    iVar1 = -0x6200;
    if (bVar6 == 0) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int get_one_and_zeros_padding( unsigned char *input, size_t input_len,
                                      size_t *data_len )
{
    size_t i;
    unsigned char done = 0, prev_done, bad;

    if( NULL == input || NULL == data_len )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    bad = 0x80;
    *data_len = 0;
    for( i = input_len; i > 0; i-- )
    {
        prev_done = done;
        done |= ( input[i - 1] != 0 );
        *data_len |= ( i - 1 ) * ( done != prev_done );
        bad ^= input[i - 1] * ( done != prev_done );
    }

    return( MBEDTLS_ERR_CIPHER_INVALID_PADDING * ( bad != 0 ) );

}